

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::internal::write_exponent<char,char*>(int exp,char *it)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  
  uVar2 = (ulong)(uint)-exp;
  if (0 < exp) {
    uVar2 = (ulong)(uint)exp;
  }
  *it = (char)(exp >> 0x1f) * -2 + '+';
  pcVar3 = it + 1;
  uVar1 = (uint)uVar2;
  if (99 < uVar1) {
    if (999 < uVar1) {
      it[1] = basic_data<void>::digits[(uVar2 / 100) * 2];
      pcVar3 = it + 2;
    }
    uVar1 = uVar1 + (int)(uVar2 / 100) * -100;
    *pcVar3 = basic_data<void>::digits[(uVar2 / 100) * 2 + 1];
    pcVar3 = pcVar3 + 1;
  }
  *(undefined2 *)pcVar3 = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar1 * 2);
  return pcVar3 + 2;
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}